

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall fasttext::Model::computeOutputSigmoid(Model *this,Vector *hidden,Vector *output)

{
  float fVar1;
  int iVar2;
  pointer pfVar3;
  pointer pfVar4;
  long lVar5;
  float fVar6;
  
  computeOutput(this,hidden,output);
  iVar2 = this->osz_;
  if (0 < (long)iVar2) {
    pfVar3 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      fVar1 = pfVar3[lVar5];
      fVar6 = 0.0;
      if ((-8.0 <= fVar1) && (fVar6 = 1.0, fVar1 <= 8.0)) {
        fVar6 = pfVar4[(long)((fVar1 + 8.0) * 512.0 * 0.125 * 0.5)];
      }
      pfVar3[lVar5] = fVar6;
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
  }
  return;
}

Assistant:

void Model::computeOutputSigmoid(Vector& hidden, Vector& output) const {
	computeOutput(hidden, output);
	for (int32_t i = 0; i < osz_; i++) {
		output[i] = sigmoid(output[i]);
	}
}